

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like_optimizations.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::LikeOptimizationRule::ApplyRule
          (LikeOptimizationRule *this,BoundFunctionExpression *expr,ScalarFunction *function,
          string *pattern,bool is_not_like)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  _func_int **pp_Var3;
  undefined8 uVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  _Head_base<0UL,_duckdb::Expression_*,_false> this_00;
  pointer pBVar6;
  reference pvVar7;
  _Tuple_impl<0UL,_duckdb::BoundOperatorExpression_*,_std::default_delete<duckdb::BoundOperatorExpression>_>
  this_01;
  pointer pBVar8;
  pointer *__ptr;
  undefined7 in_register_00000081;
  long *plVar9;
  char in_R9B;
  templated_unique_single_t new_function;
  templated_unique_single_t negation;
  undefined1 local_d0 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  Value local_a8;
  Value local_68;
  
  plVar9 = (long *)CONCAT71(in_register_00000081,is_not_like);
  (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
  local_68.type_.id_ = INVALID;
  local_68.type_.physical_type_ = ~INVALID;
  local_68.type_._2_6_ = 0;
  make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalType&,duckdb::ScalarFunction,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,decltype(nullptr)>
            ((LogicalType *)local_d0,
             (ScalarFunction *)
             &(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.extra_info.
              field_2,(vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                       *)pattern,
             &function[1].super_BaseScalarFunction.super_SimpleFunction.arguments.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_68.type_.id_ = STRING_LITERAL;
  _Var5 = ::std::
          __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    ((char *)*plVar9,(char *)*plVar9 + plVar9[1],
                     (_Iter_equals_val<const_char>)&local_68);
  plVar9[1] = (long)_Var5._M_current - *plVar9;
  *_Var5._M_current = '\0';
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 == paVar1) {
    local_b8._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_b8._8_8_ = plVar9[3];
    local_d0._8_8_ = &local_b8;
  }
  else {
    local_b8._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_d0._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar9;
  }
  local_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar9[1];
  *plVar9 = (long)paVar1;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  Value::Value(&local_a8,(string *)(local_d0 + 8));
  this_00._M_head_impl = (Expression *)operator_new(0x98);
  Value::Value(&local_68,&local_a8);
  BoundConstantExpression::BoundConstantExpression
            ((BoundConstantExpression *)this_00._M_head_impl,&local_68);
  Value::~Value(&local_68);
  pBVar6 = unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
                         *)local_d0);
  pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](&pBVar6->children,1);
  _Var2._M_head_impl =
       (pvVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = this_00._M_head_impl;
  if (_Var2._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
  }
  Value::~Value(&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._8_8_ != &local_b8) {
    operator_delete((void *)local_d0._8_8_);
  }
  uVar4 = local_d0._0_8_;
  local_d0._0_8_ =
       (_Tuple_impl<0UL,_duckdb::BoundFunctionExpression_*,_std::default_delete<duckdb::BoundFunctionExpression>_>
        )0x0;
  pp_Var3 = (this->super_Rule)._vptr_Rule;
  (this->super_Rule)._vptr_Rule = (_func_int **)uVar4;
  if (pp_Var3 != (_func_int **)0x0) {
    (**(code **)(*pp_Var3 + 8))();
  }
  if (in_R9B != '\0') {
    this_01.super__Head_base<0UL,_duckdb::BoundOperatorExpression_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::BoundOperatorExpression_*,_false>)operator_new(0x70);
    LogicalType::LogicalType(&local_68.type_,BOOLEAN);
    BoundOperatorExpression::BoundOperatorExpression
              ((BoundOperatorExpression *)
               this_01.super__Head_base<0UL,_duckdb::BoundOperatorExpression_*,_false>._M_head_impl,
               OPERATOR_NOT,&local_68.type_);
    local_a8.type_._0_8_ =
         this_01.super__Head_base<0UL,_duckdb::BoundOperatorExpression_*,_false>._M_head_impl;
    LogicalType::~LogicalType(&local_68.type_);
    pBVar8 = unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
             ::operator->((unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                           *)&local_a8);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&pBVar8->children,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)this
              );
    uVar4 = local_a8.type_._0_8_;
    local_a8.type_._0_8_ =
         (tuple<duckdb::BoundOperatorExpression_*,_std::default_delete<duckdb::BoundOperatorExpression>_>
          )0x0;
    pp_Var3 = (this->super_Rule)._vptr_Rule;
    (this->super_Rule)._vptr_Rule = (_func_int **)uVar4;
    if (pp_Var3 != (_func_int **)0x0) {
      (**(code **)(*pp_Var3 + 8))();
    }
    if ((BoundOperatorExpression *)local_a8.type_._0_8_ != (BoundOperatorExpression *)0x0) {
      (**(code **)(*(long *)local_a8.type_._0_8_ + 8))();
    }
  }
  if ((_Head_base<0UL,_duckdb::BoundFunctionExpression_*,_false>)local_d0._0_8_ !=
      (_Head_base<0UL,_duckdb::BoundFunctionExpression_*,_false>)0x0) {
    (*(((Expression *)local_d0._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> LikeOptimizationRule::ApplyRule(BoundFunctionExpression &expr, ScalarFunction function,
                                                       string pattern, bool is_not_like) {
	// replace LIKE by an optimized function
	unique_ptr<Expression> result;
	auto new_function =
	    make_uniq<BoundFunctionExpression>(expr.return_type, std::move(function), std::move(expr.children), nullptr);

	// removing "%" from the pattern
	pattern.erase(std::remove(pattern.begin(), pattern.end(), '%'), pattern.end());

	new_function->children[1] = make_uniq<BoundConstantExpression>(Value(std::move(pattern)));

	result = std::move(new_function);
	if (is_not_like) {
		auto negation = make_uniq<BoundOperatorExpression>(ExpressionType::OPERATOR_NOT, LogicalType::BOOLEAN);
		negation->children.push_back(std::move(result));
		result = std::move(negation);
	}

	return result;
}